

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biomenoise.c
# Opt level: O0

int init_climate_seed(DoublePerlinNoise *dpn,PerlinNoise *oct,uint64_t xlo,uint64_t xhi,int large,
                     int nptype,int nmax)

{
  int iVar1;
  DoublePerlinNoise *in_RCX;
  ulong uVar2;
  ulong uVar3;
  ulong in_RDX;
  int in_ESI;
  int in_R8D;
  uint in_R9D;
  int n;
  Xoroshiro pxr;
  int in_stack_ffffffffffffffc0;
  int iVar4;
  
  iVar4 = 0;
  switch(in_R9D) {
  case 0:
    uVar2 = 0x5c7e6b29735f0d7f;
    if (in_R8D != 0) {
      uVar2 = 0x944b0073edf549db;
    }
    uVar3 = 0xf7d86f1bbc734988;
    if (in_R8D != 0) {
      uVar3 = 0x4ff44347e9d22b96;
    }
    iVar1 = xDoublePerlinInit(in_RCX,(Xoroshiro *)CONCAT44(in_R8D,in_R9D),
                              (PerlinNoise *)((ulong)in_RCX ^ uVar3),(double *)(in_RDX ^ uVar2),0,
                              in_stack_ffffffffffffffc0,in_ESI);
    iVar1 = iVar1 + iVar4;
    break;
  case 1:
    uVar2 = 0x81bb4d22e8dc168e;
    if (in_R8D != 0) {
      uVar2 = 0x71b8ab943dbd5301;
    }
    uVar3 = 0xf1c8b4bea16303cd;
    if (in_R8D != 0) {
      uVar3 = 0xbb63ddcf39ff7a2b;
    }
    iVar1 = xDoublePerlinInit(in_RCX,(Xoroshiro *)CONCAT44(in_R8D,in_R9D),
                              (PerlinNoise *)((ulong)in_RCX ^ uVar3),(double *)(in_RDX ^ uVar2),0,
                              in_stack_ffffffffffffffc0,in_ESI);
    iVar1 = iVar1 + iVar4;
    break;
  case 2:
    uVar2 = 0x83886c9d0ae3a662;
    if (in_R8D != 0) {
      uVar2 = 0x9a3f51a113fce8dc;
    }
    uVar3 = 0xafa638a61b42e8ad;
    if (in_R8D != 0) {
      uVar3 = 0xee2dbd157e5dcdad;
    }
    iVar1 = xDoublePerlinInit(in_RCX,(Xoroshiro *)CONCAT44(in_R8D,in_R9D),
                              (PerlinNoise *)((ulong)in_RCX ^ uVar3),(double *)(in_RDX ^ uVar2),0,
                              in_stack_ffffffffffffffc0,in_ESI);
    iVar1 = iVar1 + iVar4;
    break;
  case 3:
    uVar2 = 0xd02491e6058f6fd8;
    if (in_R8D != 0) {
      uVar2 = 0x8c984b1f8702a951;
    }
    uVar3 = 0x4792512c94c17a80;
    if (in_R8D != 0) {
      uVar3 = 0xead7b1f92bae535f;
    }
    iVar1 = xDoublePerlinInit(in_RCX,(Xoroshiro *)CONCAT44(in_R8D,in_R9D),
                              (PerlinNoise *)((ulong)in_RCX ^ uVar3),(double *)(in_RDX ^ uVar2),0,
                              in_stack_ffffffffffffffc0,in_ESI);
    iVar1 = iVar1 + iVar4;
    break;
  case 4:
    iVar1 = xDoublePerlinInit(in_RCX,(Xoroshiro *)CONCAT44(in_R8D,in_R9D),
                              (PerlinNoise *)((ulong)in_RCX ^ 0x3f3dfb40a54febd5),
                              (double *)(in_RDX ^ 0x80518cf6af25384),0,in_stack_ffffffffffffffc0,
                              in_ESI);
    iVar1 = iVar1 + iVar4;
    break;
  case 5:
    iVar1 = xDoublePerlinInit(in_RCX,(Xoroshiro *)CONCAT44(in_R8D,in_R9D),
                              (PerlinNoise *)((ulong)in_RCX ^ 0x1beeeb324a0f24ea),
                              (double *)(in_RDX ^ 0xefc8ef4d36102b34),0,in_stack_ffffffffffffffc0,
                              in_ESI);
    iVar1 = iVar1 + iVar4;
    break;
  default:
    printf("unsupported climate parameter %d\n",(ulong)in_R9D);
    exit(1);
  }
  return iVar1;
}

Assistant:

static int init_climate_seed(
    DoublePerlinNoise *dpn, PerlinNoise *oct,
    uint64_t xlo, uint64_t xhi, int large, int nptype, int nmax
    )
{
    Xoroshiro pxr;
    int n = 0;

    switch (nptype)
    {
    case NP_SHIFT: {
        static const double amp[] = {1, 1, 1, 0};
        // md5 "minecraft:offset"
        pxr.lo = xlo ^ 0x080518cf6af25384;
        pxr.hi = xhi ^ 0x3f3dfb40a54febd5;
        n += xDoublePerlinInit(dpn, &pxr, oct, amp, -3, 4, nmax);
        } break;

    case NP_TEMPERATURE: {
        static const double amp[] = {1.5, 0, 1, 0, 0, 0};
        // md5 "minecraft:temperature" or "minecraft:temperature_large"
        pxr.lo = xlo ^ (large ? 0x944b0073edf549db : 0x5c7e6b29735f0d7f);
        pxr.hi = xhi ^ (large ? 0x4ff44347e9d22b96 : 0xf7d86f1bbc734988);
        n += xDoublePerlinInit(dpn, &pxr, oct, amp, large ? -12 : -10, 6, nmax);
        } break;

    case NP_HUMIDITY: {
        static const double amp[] = {1, 1, 0, 0, 0, 0};
        // md5 "minecraft:vegetation" or "minecraft:vegetation_large"
        pxr.lo = xlo ^ (large ? 0x71b8ab943dbd5301 : 0x81bb4d22e8dc168e);
        pxr.hi = xhi ^ (large ? 0xbb63ddcf39ff7a2b : 0xf1c8b4bea16303cd);
        n += xDoublePerlinInit(dpn, &pxr, oct, amp, large ? -10 : -8, 6, nmax);
        } break;

    case NP_CONTINENTALNESS: {
        static const double amp[] = {1, 1, 2, 2, 2, 1, 1, 1, 1};
        // md5 "minecraft:continentalness" or "minecraft:continentalness_large"
        pxr.lo = xlo ^ (large ? 0x9a3f51a113fce8dc : 0x83886c9d0ae3a662);
        pxr.hi = xhi ^ (large ? 0xee2dbd157e5dcdad : 0xafa638a61b42e8ad);
        n += xDoublePerlinInit(dpn, &pxr, oct, amp, large ? -11 : -9, 9, nmax);
        } break;

    case NP_EROSION: {
        static const double amp[] = {1, 1, 0, 1, 1};
        // md5 "minecraft:erosion" or "minecraft:erosion_large"
        pxr.lo = xlo ^ (large ? 0x8c984b1f8702a951 : 0xd02491e6058f6fd8);
        pxr.hi = xhi ^ (large ? 0xead7b1f92bae535f : 0x4792512c94c17a80);
        n += xDoublePerlinInit(dpn, &pxr, oct, amp, large ? -11 : -9, 5, nmax);
        } break;

    case NP_WEIRDNESS: {
        static const double amp[] = {1, 2, 1, 0, 0, 0};
        // md5 "minecraft:ridge"
        pxr.lo = xlo ^ 0xefc8ef4d36102b34;
        pxr.hi = xhi ^ 0x1beeeb324a0f24ea;
        n += xDoublePerlinInit(dpn, &pxr, oct, amp, -7, 6, nmax);
        } break;

    default:
        printf("unsupported climate parameter %d\n", nptype);
        exit(1);
    }
    return n;
}